

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O1

ChStreamInAscii * __thiscall chrono::ChStreamInAscii::operator>>(ChStreamInAscii *this,float *dVal)

{
  char *pcVar1;
  double dVar2;
  string buffer;
  char *local_60;
  long local_58;
  char local_50;
  undefined7 uStack_4f;
  long *local_40 [2];
  long local_30 [2];
  
  local_58 = 0;
  local_50 = '\0';
  local_60 = &local_50;
  (*(this->super_ChStreamIn)._vptr_ChStreamIn[0xb])(this,&local_60);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>((string *)local_40,local_60,local_60 + local_58);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  pcVar1 = local_60;
  dVar2 = atof(local_60);
  *dVal = (float)dVar2;
  if (pcVar1 != &local_50) {
    operator_delete(pcVar1,CONCAT71(uStack_4f,local_50) + 1);
  }
  return this;
}

Assistant:

ChStreamInAscii& ChStreamInAscii::operator>>(float& dVal) {
    std::string buffer;
    *this >> buffer;
    RemoveTrailingCommas(buffer);
    dVal = (float)(atof(buffer.c_str()));
    // if (errno)
    // throw (ChException( "String " +buffer+ " is not a valid number format"));
    return *this;
}